

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::NoResetNotificationCase::iterate(NoResetNotificationCase *this)

{
  glActiveTextureFunc *this_00;
  ostringstream *this_01;
  TestLog *pTVar1;
  GLenum GVar2;
  char *description;
  bool bVar3;
  deUint8 robustAccessGL;
  GLint reset;
  RenderingContext context;
  Enum<int,_2UL> local_1c18;
  Enum<int,_2UL> local_1c08;
  EGLint attribList [9];
  MessageBuilder local_1bc8;
  Functions gl;
  
  pTVar1 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  this_00 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  attribList[4] = 0x30bf;
  attribList[5] = 1;
  attribList[6] = 0x3138;
  attribList[7] = 0x31be;
  attribList[0] = 0x3098;
  attribList[1] = 3;
  attribList[2] = 0x30fb;
  attribList[3] = 1;
  attribList[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,attribList);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  RenderingContext::RenderingContext
            (&context,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.activeShaderProgram);
  RenderingContext::makeCurrent(&context,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions(&gl);
  RenderingContext::initGLFunctions(&context,&gl);
  checkRequiredGLRobustnessExtension(attribList,&gl);
  (*gl.getBooleanv)(0x90f3,&robustAccessGL);
  GVar2 = (*gl.getError)();
  glu::checkError(GVar2,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5bd);
  reset = 0;
  (*gl.getIntegerv)(0x8256,&reset);
  GVar2 = (*gl.getError)();
  glu::checkError(GVar2,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5c1);
  bVar3 = reset != 0x8261;
  if (bVar3) {
    this_01 = &local_1bc8.m_str;
    local_1bc8.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Test failed! glGetIntegerv() returned wrong value. [");
    local_1c08.m_getName = glu::getErrorName;
    local_1c08.m_value = reset;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c08,(ostream *)this_01);
    std::operator<<((ostream *)this_01,", expected ");
    local_1c18.m_getName = glu::getErrorName;
    local_1c18.m_value = 0x8261;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c18,(ostream *)this_01);
    std::operator<<((ostream *)this_01,"]");
    tcu::MessageBuilder::operator<<(&local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    description = "Fail";
  }
  else {
    (*gl.getGraphicsResetStatus)();
    GVar2 = (*gl.getError)();
    glu::checkError(GVar2,"getGraphicsResetStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x5cd);
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar3,description);
  RenderingContext::~RenderingContext(&context);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_NO_RESET_NOTIFICATION\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_NO_RESET_NOTIFICATION,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_NO_RESET_NOTIFICATION)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << glu::getErrorStr(reset) << ", expected " << glu::getErrorStr(GL_NO_RESET_NOTIFICATION) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}